

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONValue.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
* __thiscall
JSONValue::ObjectKeys_abi_cxx11_
          (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *__return_storage_ptr__,JSONValue *this)

{
  wstring *pwVar1;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->type == JSONType_Object) {
    pwVar1 = (this->field_1).string_value;
    p_Var2 = *(_Rb_tree_node_base **)((long)&pwVar1->field_2 + 8);
    while (p_Var2 != (_Rb_tree_node_base *)&pwVar1->_M_string_length) {
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)(p_Var2 + 1));
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
      pwVar1 = (this->field_1).string_value;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::wstring> JSONValue::ObjectKeys() const
{
	std::vector<std::wstring> keys;

	if (type == JSONType_Object)
	{
		JSONObject::const_iterator iter = object_value->begin();
		while (iter != object_value->end())
		{
			keys.push_back(iter->first);

			iter++;
		}
	}

	return keys;
}